

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

string * deqp::gls::ShaderExecUtil::generatePassthroughFragmentShader
                   (string *__return_storage_ptr__,ShaderSpec *shaderSpec,bool useIntOutputs,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *outLocationMap,string *inputPrefix,string *outputPrefix)

{
  bool bVar1;
  DataType DVar2;
  char *pcVar3;
  ostream *poVar4;
  ulong uVar5;
  pointer pSVar6;
  pointer __rhs;
  DataType local_2e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  DeclareVariable local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  DeclareVariable local_230;
  undefined1 local_1f0 [8];
  VarType intType;
  DataType intBaseType;
  int vecSize;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_1c8;
  const_iterator output;
  undefined1 local_1b0 [8];
  ostringstream src;
  string *outputPrefix_local;
  string *inputPrefix_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *outLocationMap_local;
  bool useIntOutputs_local;
  ShaderSpec *shaderSpec_local;
  
  src._368_8_ = outputPrefix;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  pcVar3 = glu::getGLSLVersionDeclaration(shaderSpec->version);
  poVar4 = std::operator<<((ostream *)local_1b0,pcVar3);
  std::operator<<(poVar4,"\n");
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)local_1b0,(string *)&shaderSpec->globalDeclarations);
    std::operator<<(poVar4,"\n");
  }
  local_1c8._M_current =
       (Symbol *)
       std::
       vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
       ::begin(&shaderSpec->outputs);
  while( true ) {
    _intBaseType = std::
                   vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                   ::end(&shaderSpec->outputs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1c8,
                       (__normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                        *)&intBaseType);
    if (!bVar1) break;
    pSVar6 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_1c8);
    DVar2 = glu::VarType::getBasicType(&pSVar6->varType);
    bVar1 = glu::isDataTypeBoolOrBVec(DVar2);
    if (bVar1) {
      pSVar6 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_1c8);
      DVar2 = glu::VarType::getBasicType(&pSVar6->varType);
      intType.m_data._12_4_ = glu::getDataTypeScalarSize(DVar2);
      if ((int)intType.m_data._12_4_ < 2) {
        local_2e4 = TYPE_INT;
      }
      else {
        local_2e4 = glu::getDataTypeIntVec(intType.m_data._12_4_);
      }
      intType.m_data.array.size = local_2e4;
      glu::VarType::VarType((VarType *)local_1f0,local_2e4,PRECISION_HIGHP);
      poVar4 = std::operator<<((ostream *)local_1b0,"flat in ");
      pSVar6 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_1c8);
      std::operator+(&local_250,inputPrefix,&pSVar6->name);
      glu::declare(&local_230,(VarType *)local_1f0,&local_250,0);
      poVar4 = glu::decl::operator<<(poVar4,&local_230);
      std::operator<<(poVar4,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      glu::VarType::~VarType((VarType *)local_1f0);
    }
    else {
      poVar4 = std::operator<<((ostream *)local_1b0,"flat in ");
      pSVar6 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_1c8);
      __rhs = __gnu_cxx::
              __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
              ::operator->(&local_1c8);
      std::operator+(&local_2b0,inputPrefix,&__rhs->name);
      glu::declare(&local_290,&pSVar6->varType,&local_2b0,0);
      poVar4 = glu::decl::operator<<(poVar4,&local_290);
      std::operator<<(poVar4,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator++(&local_1c8);
  }
  generateFragShaderOutputDecl
            ((ostream *)local_1b0,shaderSpec,useIntOutputs,outLocationMap,(string *)src._368_8_);
  std::operator<<((ostream *)local_1b0,"\nvoid main (void)\n{\n");
  generateFragShaderOutAssign
            ((ostream *)local_1b0,shaderSpec,useIntOutputs,inputPrefix,(string *)src._368_8_);
  std::operator<<((ostream *)local_1b0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

static std::string generatePassthroughFragmentShader (const ShaderSpec& shaderSpec, bool useIntOutputs, const std::map<std::string, int>& outLocationMap, const std::string& inputPrefix, const std::string& outputPrefix)
{
	DE_ASSERT(glu::glslVersionUsesInOutQualifiers(shaderSpec.version));

	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(shaderSpec.version) << "\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
	{
		if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::VarType		intType		(intBaseType, glu::PRECISION_HIGHP);

			src << "flat in " << glu::declare(intType, inputPrefix + output->name) << ";\n";
		}
		else
			src << "flat in " << glu::declare(output->varType, inputPrefix + output->name) << ";\n";
	}

	generateFragShaderOutputDecl(src, shaderSpec, useIntOutputs, outLocationMap, outputPrefix);

	src << "\nvoid main (void)\n{\n";

	generateFragShaderOutAssign(src, shaderSpec, useIntOutputs, inputPrefix, outputPrefix);

	src << "}\n";

	return src.str();
}